

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

long gmlc::utilities::strViewToInteger<long>(string_view input,size_t *charactersUsed)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  long *__value;
  out_of_range *this;
  invalid_argument *this_00;
  long *in_RDX;
  __integer_from_chars_result_type<long> _Var5;
  __integer_from_chars_result_type<long> conversionResult;
  size_t additionalChars;
  long val;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb0;
  long local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  if (in_RDX != (long *)0x0) {
    *in_RDX = 0;
  }
  local_30 = 0;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (1 < sVar2) {
    while (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
          *pvVar3 == ' ') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
      local_30 = local_30 + 1;
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar1) {
        if (in_RDX == (long *)0x0) {
          return 0;
        }
        *in_RDX = local_30;
        return 0;
      }
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
    if (((*pvVar3 == '0') &&
        (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,1),
        *pvVar3 != 'X')) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,1),
       *pvVar3 != 'x')) {
      while (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0)
            , *pvVar3 == '0') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
        local_30 = local_30 + 1;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
        if (bVar1) {
          if (in_RDX != (long *)0x0) {
            *in_RDX = local_30;
          }
          return 0;
        }
      }
    }
  }
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  __value = (long *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  _Var5 = std::from_chars<long>
                    (in_stack_ffffffffffffffb0,pvVar4,__value,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (_Var5.ec == 0) {
    if (in_RDX == (long *)0x0) {
      return 0;
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    *in_RDX = (long)(_Var5.ptr + (local_30 - (long)pvVar4));
    return 0;
  }
  if (_Var5.ec == result_out_of_range) {
    if (in_RDX != (long *)0x0) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
      *in_RDX = (long)_Var5.ptr - (long)pvVar4;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"conversion type does not support the string conversion");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"unable to convert string");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}